

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

int CECoordinates::Observed2CIRS
              (double az,double zen,double *ra,double *dec,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  double dVar1;
  double dVar2;
  int iVar3;
  CEDate date;
  CEDate local_58;
  
  CEDate::CEDate(&local_58,julian_date,JD);
  dVar1 = CEDate::GetMJD2JDFactor();
  dVar2 = CEDate::MJD(&local_58);
  iVar3 = iauAtoi13(SUB84(az,0),zen,dVar1,SUB84(dVar2,0),dut1,longitude,latitude,elevation_m,"A",ra,
                    dec);
  CEDate::~CEDate(&local_58);
  return iVar3;
}

Assistant:

int CECoordinates::Observed2CIRS(double az, double zen,
                                 double *ra, double *dec,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    CEDate date(julian_date, CEDateType::JD);
    int err_code = iauAtoi13("A", az, zen,
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             dut1,
                             longitude, latitude,
                             elevation_m,
                             xp, yp,
                             pressure_hPa,
                             temperature_celsius,
                             relative_humidity,
                             wavelength_um,
                             ra, dec) ;
    return err_code ;
}